

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_create_string.cpp
# Opt level: O0

char * create_by_char(char ch,int size)

{
  char *pcVar1;
  ulong uVar2;
  int local_1c;
  int i;
  char *str;
  int size_local;
  char ch_local;
  
  uVar2 = (ulong)(size + 1);
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  for (local_1c = 0; local_1c <= size; local_1c = local_1c + 1) {
    if (local_1c < size) {
      pcVar1[local_1c] = ch;
    }
    else {
      pcVar1[local_1c] = '\0';
    }
  }
  return pcVar1;
}

Assistant:

char * create_by_char(char ch, int size)
{
    //  使用 new 创建指定长度字符串，最后一位填充为 '\0'
    char *str = new char[size + 1];
    for(int i = 0; i <= size; i++) {
        if (i < size) {
            // 每个字符指向的地址
            str[i] = ch;
        } else {
            str[i] = '\0';
        }
    }
    //  返回指针
    return str;
}